

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O0

void __thiscall minibag::View::addQuery(View *this,Bag *bag,Time *start_time,Time *end_time)

{
  BagMode BVar1;
  undefined8 uVar2;
  Bag *_bag;
  BagQuery *this_00;
  Bag *in_RSI;
  long in_RDI;
  BagQuery *in_stack_00000008;
  View *in_stack_00000010;
  function<bool_(const_minibag::ConnectionInfo_*)> query;
  undefined4 in_stack_ffffffffffffff08;
  uint32_t in_stack_ffffffffffffff0c;
  BagException *in_stack_ffffffffffffff10;
  TrueQuery *in_stack_ffffffffffffff18;
  function<bool_(const_minibag::ConnectionInfo_*)> *in_stack_ffffffffffffff20;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  char *in_stack_ffffffffffffff48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  
  BVar1 = Bag::getMode(in_RSI);
  if ((BVar1 & Read) != Read) {
    uVar2 = __cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
               (allocator<char> *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40));
    BagException::BagException
              (in_stack_ffffffffffffff10,
               (string *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    __cxa_throw(uVar2,&BagException::typeinfo,BagException::~BagException);
  }
  std::function<bool(minibag::ConnectionInfo_const*)>::function<minibag::View::TrueQuery,void>
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  _bag = (Bag *)(in_RDI + 0x18);
  this_00 = (BagQuery *)operator_new(0x40);
  Query::Query((Query *)this_00,(function<bool_(const_minibag::ConnectionInfo_*)> *)_bag,
               (Time *)in_RSI,(Time *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08))
  ;
  BagQuery::BagQuery(this_00,_bag,(Query *)in_RSI,in_stack_ffffffffffffff0c);
  std::vector<minibag::BagQuery_*,_std::allocator<minibag::BagQuery_*>_>::push_back
            ((vector<minibag::BagQuery_*,_std::allocator<minibag::BagQuery_*>_> *)in_RSI,
             (value_type *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  Query::~Query((Query *)0x17ae4e);
  std::vector<minibag::BagQuery_*,_std::allocator<minibag::BagQuery_*>_>::back
            ((vector<minibag::BagQuery_*,_std::allocator<minibag::BagQuery_*>_> *)in_RSI);
  updateQueries(in_stack_00000010,in_stack_00000008);
  std::function<bool_(const_minibag::ConnectionInfo_*)>::~function
            ((function<bool_(const_minibag::ConnectionInfo_*)> *)0x17ae78);
  return;
}

Assistant:

void View::addQuery(Bag const& bag, miniros::Time const& start_time, miniros::Time const& end_time) {
    if ((bag.getMode() & bagmode::Read) != bagmode::Read)
        throw BagException("Bag not opened for reading");

    std::function<bool(ConnectionInfo const*)> query = TrueQuery();

    queries_.push_back(new BagQuery(&bag, Query(query, start_time, end_time), bag.bag_revision_));

    updateQueries(queries_.back());
}